

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::ParseEXRHeader
              (HeaderInfo *info,bool *empty_header,EXRVersion *version,string *err,uchar *buf)

{
  int iVar1;
  uint *puVar2;
  byte *pbVar3;
  reference pvVar4;
  size_type sVar5;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *pvVar6;
  char *pcVar7;
  string *in_RCX;
  long in_RDX;
  undefined1 *in_RSI;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *in_RDI;
  char *in_R8;
  EXRAttribute attrib;
  bool ok;
  uchar tile_mode;
  uint y_size;
  uint x_size;
  char *marker_next;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attr_type;
  string attr_name;
  char *marker;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc10;
  value_type *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc68;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *in_stack_fffffffffffffc70;
  char local_2c8 [255];
  undefined1 local_1c9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8 [10];
  undefined1 local_c9;
  string *local_c8;
  undefined4 local_c0;
  byte local_b2;
  byte local_b1;
  uint local_b0;
  uint local_ac;
  int local_a8;
  char *local_98;
  undefined1 local_90 [56];
  string local_58 [32];
  char *local_38;
  char *local_30;
  string *local_28;
  long local_20;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *local_10;
  int local_4;
  
  if (in_RSI != (undefined1 *)0x0) {
    *in_RSI = 0;
  }
  if ((*(int *)(in_RDX + 0x10) != 0) && (*in_R8 == '\0')) {
    if (in_RSI != (undefined1 *)0x0) {
      *in_RSI = 1;
    }
    return 0;
  }
  *(undefined4 *)
   &in_RDI[2].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&in_RDI[2].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &in_RDI[2].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = 0;
  *(undefined4 *)
   ((long)&in_RDI[2].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   &in_RDI[2].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[2].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined4 *)
   &in_RDI[3].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&in_RDI[3].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &in_RDI[3].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = 0;
  *(undefined4 *)
   ((long)&in_RDI[3].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   &in_RDI[3].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[3].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0xbf800000;
  *(undefined4 *)
   &in_RDI[4].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = 0xbf800000;
  *(undefined4 *)
   &in_RDI[4].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = 0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[4].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0xffffffff;
  *(undefined4 *)
   &in_RDI[4].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = 0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[4].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0xffffffff;
  local_38 = in_R8;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::clear
            ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)0x159b39);
  do {
    std::__cxx11::string::string(local_58);
    std::__cxx11::string::string((string *)(local_90 + 0x18));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x159b78);
    local_98 = ReadAttribute(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
    if (local_98 == (char *)0x0) {
      local_38 = local_38 + 1;
      local_a8 = 2;
    }
    else {
      if ((*(int *)(local_20 + 4) == 0) ||
         (iVar1 = std::__cxx11::string::compare((char *)local_58), iVar1 != 0)) {
        iVar1 = std::__cxx11::string::compare((char *)local_58);
        if (iVar1 == 0) {
          local_b2 = 0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,0);
          pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,0);
          if (*pbVar3 < 4) {
            local_b2 = 1;
          }
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,0);
          if (*pvVar4 == '\x04') {
            local_b2 = 1;
          }
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,0);
          if (*pvVar4 == 0x80) {
            if (local_28 != (string *)0x0) {
              std::__cxx11::string::operator=(local_28,"ZFP compression is not supported.");
            }
            local_4 = -7;
            local_a8 = 1;
          }
          else {
            if ((local_b2 & 1) != 0) {
              pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,
                                  0);
              *(uint *)((long)&local_10[5].
                               super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4) = (uint)*pbVar3;
              goto LAB_0015a555;
            }
            if (local_28 != (string *)0x0) {
              std::__cxx11::string::operator=(local_28,"Unknown compression type.");
            }
            local_4 = -7;
            local_a8 = 1;
          }
          goto LAB_0015a570;
        }
        iVar1 = std::__cxx11::string::compare((char *)local_58);
        if (iVar1 == 0) {
          ReadChannelInfo(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          sVar5 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::size
                            (local_10);
          if (sVar5 == 0) {
            if (local_28 != (string *)0x0) {
              std::__cxx11::string::operator=(local_28,"# of channels is zero.");
            }
            local_4 = -4;
            local_a8 = 1;
            goto LAB_0015a570;
          }
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_58);
          if (iVar1 == 0) {
            pvVar6 = local_10 + 2;
            pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_fffffffffffffc10,
                                CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            *(undefined4 *)
             &(pvVar6->
              super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
              _M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pvVar4;
            pvVar6 = local_10 + 2;
            pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_fffffffffffffc10,
                                CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            *(undefined4 *)
             ((long)&(pvVar6->
                     super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                     )._M_impl.super__Vector_impl_data._M_start + 4) = *(undefined4 *)pvVar4;
            pvVar6 = local_10 + 2;
            pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_fffffffffffffc10,
                                CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            *(undefined4 *)
             &(pvVar6->
              super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
              _M_impl.super__Vector_impl_data._M_finish = *(undefined4 *)pvVar4;
            pvVar6 = local_10 + 2;
            pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_fffffffffffffc10,
                                CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            *(undefined4 *)
             ((long)&(pvVar6->
                     super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish + 4) = *(undefined4 *)pvVar4;
            swap4((uint *)(local_10 + 2));
            swap4((uint *)((long)&local_10[2].
                                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4));
            swap4((uint *)&local_10[2].
                           super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
            swap4((uint *)((long)&local_10[2].
                                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4));
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)local_58);
            if (iVar1 == 0) {
              pvVar6 = local_10 + 2;
              pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 (in_stack_fffffffffffffc10,
                                  CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
              *(undefined4 *)
               ((long)&(pvVar6->
                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                   *(undefined4 *)pvVar4;
              pvVar6 = local_10 + 3;
              pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 (in_stack_fffffffffffffc10,
                                  CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
              *(undefined4 *)
               &(pvVar6->
                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
                _M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pvVar4;
              pvVar6 = local_10 + 3;
              pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 (in_stack_fffffffffffffc10,
                                  CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
              *(undefined4 *)
               ((long)&(pvVar6->
                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start + 4) = *(undefined4 *)pvVar4;
              pvVar6 = local_10 + 3;
              pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 (in_stack_fffffffffffffc10,
                                  CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
              *(undefined4 *)
               &(pvVar6->
                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
                _M_impl.super__Vector_impl_data._M_finish = *(undefined4 *)pvVar4;
              swap4((uint *)((long)&local_10[2].
                                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
              swap4((uint *)(local_10 + 3));
              swap4((uint *)((long)&local_10[3].
                                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4));
              swap4((uint *)&local_10[3].
                             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)local_58);
              if (iVar1 == 0) {
                pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_90,0);
                *(uint *)&local_10[2].
                          super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (uint)*pbVar3;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)local_58);
                if (iVar1 == 0) {
                  pvVar6 = local_10 + 4;
                  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     (in_stack_fffffffffffffc10,
                                      CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08))
                  ;
                  *(undefined4 *)
                   &(pvVar6->
                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>)
                    ._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pvVar4;
                  swap4((uint *)(local_10 + 4));
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)local_58);
                  if (iVar1 == 0) {
                    in_stack_fffffffffffffc68 =
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&local_10[3].
                                 super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
                    in_stack_fffffffffffffc70 =
                         (vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *)
                         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                   (in_stack_fffffffffffffc10,
                                    CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
                    *(undefined4 *)
                     &(in_stack_fffffffffffffc68->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_start =
                         *(undefined4 *)
                          &(in_stack_fffffffffffffc70->
                           super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                    pvVar6 = local_10 + 3;
                    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (in_stack_fffffffffffffc10,
                                        CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08
                                                ));
                    *(undefined4 *)
                     &(pvVar6->
                      super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage = *(undefined4 *)pvVar4;
                    swap4((uint *)((long)&local_10[3].
                                          super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + 4));
                    swap4((uint *)&local_10[3].
                                   super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)local_58);
                    if (iVar1 == 0) {
                      pvVar6 = local_10 + 3;
                      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                         (in_stack_fffffffffffffc10,
                                          CONCAT44(in_stack_fffffffffffffc0c,
                                                   in_stack_fffffffffffffc08));
                      *(undefined4 *)
                       ((long)&(pvVar6->
                               super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                               )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                           *(undefined4 *)pvVar4;
                      swap4((uint *)((long)&local_10[3].
                                            super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      ;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)local_58);
                      if (iVar1 == 0) {
                        pvVar6 = local_10 + 4;
                        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (in_stack_fffffffffffffc10,
                                            CONCAT44(in_stack_fffffffffffffc0c,
                                                     in_stack_fffffffffffffc08));
                        *(undefined4 *)
                         ((long)&(pvVar6->
                                 super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 4) =
                             *(undefined4 *)pvVar4;
                        swap4((uint *)((long)&local_10[4].
                                              super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 4));
                      }
                      else {
                        sVar5 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size
                                          ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                           (local_10 + 1));
                        if (sVar5 < 0x80) {
                          pcVar7 = (char *)std::__cxx11::string::c_str();
                          in_stack_fffffffffffffc18 = (value_type *)0xff;
                          strncpy(local_2c8,pcVar7,0xff);
                          local_1c9 = 0;
                          in_stack_fffffffffffffc10 = local_1c8;
                          pcVar7 = (char *)std::__cxx11::string::c_str();
                          strncpy((char *)in_stack_fffffffffffffc10,pcVar7,
                                  (size_t)in_stack_fffffffffffffc18);
                          local_c9 = 0;
                          in_stack_fffffffffffffc20 = (string *)local_90;
                          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)in_stack_fffffffffffffc20);
                          local_c0 = (undefined4)sVar5;
                          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)in_stack_fffffffffffffc20);
                          in_stack_fffffffffffffc28 = (string *)malloc(sVar5);
                          local_c8 = in_stack_fffffffffffffc28;
                          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             (in_stack_fffffffffffffc10,
                                              CONCAT44(in_stack_fffffffffffffc0c,
                                                       in_stack_fffffffffffffc08));
                          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)local_90);
                          memcpy(in_stack_fffffffffffffc28,pvVar4,sVar5);
                          std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                    ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                     in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        puVar2 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                   (in_stack_fffffffffffffc10,
                                    CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        local_ac = *puVar2;
        puVar2 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                   (in_stack_fffffffffffffc10,
                                    CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        local_b0 = *puVar2;
        pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,8);
        local_b1 = *pbVar3;
        swap4(&local_ac);
        swap4(&local_b0);
        *(uint *)&local_10[4].
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish = local_ac;
        *(uint *)((long)&local_10[4].
                         super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4) = local_b0;
        *(uint *)&local_10[4].
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = local_b1 & 3;
        *(uint *)((long)&local_10[4].
                         super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
             (int)(uint)local_b1 >> 4 & 1;
      }
LAB_0015a555:
      local_38 = local_98;
      local_a8 = 0;
    }
LAB_0015a570:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc20);
    std::__cxx11::string::~string((string *)(local_90 + 0x18));
    std::__cxx11::string::~string(local_58);
    if (local_a8 != 0) {
      if (local_a8 == 1) {
        return local_4;
      }
      *(int *)&local_10[5].
               super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
               _M_impl.super__Vector_impl_data._M_start = (int)local_38 - (int)local_30;
      return 0;
    }
    in_stack_fffffffffffffc0c = 0;
  } while( true );
}

Assistant:

static int ParseEXRHeader(HeaderInfo *info, bool *empty_header,
                          const EXRVersion *version, std::string *err,
                          const unsigned char *buf) {
  const char *marker = reinterpret_cast<const char *>(&buf[0]);

  if (empty_header) {
    (*empty_header) = false;
  }

  if (version->multipart) {
    if (marker[0] == '\0') {
      // End of header list.
      if (empty_header) {
        (*empty_header) = true;
      }
      return TINYEXR_SUCCESS;
    }
  }

  info->data_window[0] = 0;
  info->data_window[1] = 0;
  info->data_window[2] = 0;
  info->data_window[3] = 0;
  info->line_order = 0;  // @fixme
  info->display_window[0] = 0;
  info->display_window[1] = 0;
  info->display_window[2] = 0;
  info->display_window[3] = 0;
  info->screen_window_center[0] = 0.0f;
  info->screen_window_center[1] = 0.0f;
  info->screen_window_width = -1.0f;
  info->pixel_aspect_ratio = -1.0f;

  info->tile_size_x = -1;
  info->tile_size_y = -1;
  info->tile_level_mode = -1;
  info->tile_rounding_mode = -1;

  info->attributes.clear();

  // Read attributes
  for (;;) {
    std::string attr_name;
    std::string attr_type;
    std::vector<unsigned char> data;
    const char *marker_next =
        tinyexr::ReadAttribute(&attr_name, &attr_type, &data, marker);
    if (marker_next == NULL) {
      marker++;  // skip '\0'
      break;
    }

    if (version->tiled && attr_name.compare("tiles") == 0) {
      unsigned int x_size, y_size;
      unsigned char tile_mode;
      assert(data.size() == 9);
      memcpy(&x_size, &data.at(0), sizeof(int));
      memcpy(&y_size, &data.at(4), sizeof(int));
      tile_mode = data[8];
      tinyexr::swap4(&x_size);
      tinyexr::swap4(&y_size);

      info->tile_size_x = static_cast<int>(x_size);
      info->tile_size_y = static_cast<int>(y_size);

      // mode = levelMode + roundingMode * 16
      info->tile_level_mode = tile_mode & 0x3;
      info->tile_rounding_mode = (tile_mode >> 4) & 0x1;

    } else if (attr_name.compare("compression") == 0) {
      bool ok = false;
      if ((data[0] >= TINYEXR_COMPRESSIONTYPE_NONE) &&
          (data[0] < TINYEXR_COMPRESSIONTYPE_PIZ)) {
        ok = true;
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
        ok = true;
#else
        if (err) {
          (*err) = "PIZ compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
        ok = true;
#else
        if (err) {
          (*err) = "ZFP compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (!ok) {
        if (err) {
          (*err) = "Unknown compression type.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->compression_type = static_cast<int>(data[0]);

    } else if (attr_name.compare("channels") == 0) {
      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(info->channels, data);

      if (info->channels.size() < 1) {
        if (err) {
          (*err) = "# of channels is zero.";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

    } else if (attr_name.compare("dataWindow") == 0) {
      memcpy(&info->data_window[0], &data.at(0), sizeof(int));
      memcpy(&info->data_window[1], &data.at(4), sizeof(int));
      memcpy(&info->data_window[2], &data.at(8), sizeof(int));
      memcpy(&info->data_window[3], &data.at(12), sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[0]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[1]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[2]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[3]));
    } else if (attr_name.compare("displayWindow") == 0) {
      memcpy(&info->display_window[0], &data.at(0), sizeof(int));
      memcpy(&info->display_window[1], &data.at(4), sizeof(int));
      memcpy(&info->display_window[2], &data.at(8), sizeof(int));
      memcpy(&info->display_window[3], &data.at(12), sizeof(int));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[0]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[1]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[2]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[3]));
    } else if (attr_name.compare("lineOrder") == 0) {
      info->line_order = static_cast<int>(data[0]);
    } else if (attr_name.compare("pixelAspectRatio") == 0) {
      memcpy(&info->pixel_aspect_ratio, &data.at(0), sizeof(float));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->pixel_aspect_ratio));
    } else if (attr_name.compare("screenWindowCenter") == 0) {
      memcpy(&info->screen_window_center[0], &data.at(0), sizeof(float));
      memcpy(&info->screen_window_center[1], &data.at(4), sizeof(float));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->screen_window_center[0]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->screen_window_center[1]));
    } else if (attr_name.compare("screenWindowWidth") == 0) {
      memcpy(&info->screen_window_width, &data.at(0), sizeof(float));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->screen_window_width));

    } else if (attr_name.compare("chunkCount") == 0) {
      memcpy(&info->chunk_count, &data.at(0), sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->chunk_count));
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (info->attributes.size() < TINYEXR_MAX_ATTRIBUTES) {
        EXRAttribute attrib;
        strncpy(attrib.name, attr_name.c_str(), 255);
        attrib.name[255] = '\0';
        strncpy(attrib.type, attr_type.c_str(), 255);
        attrib.type[255] = '\0';
        attrib.size = static_cast<int>(data.size());
        attrib.value = static_cast<unsigned char *>(malloc(data.size()));
        memcpy(reinterpret_cast<char *>(attrib.value), &data.at(0),
               data.size());
        info->attributes.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  info->header_len = static_cast<unsigned int>(
      reinterpret_cast<const unsigned char *>(marker) - buf);

  return TINYEXR_SUCCESS;
}